

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

unsigned_long ot::commissioner::utils::Decode<unsigned_long>(uint8_t *aBuf,size_t aLength)

{
  unsigned_long uVar1;
  size_t i;
  long lVar2;
  
  if (7 < aLength) {
    uVar1 = 0;
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      uVar1 = uVar1 << 8 | (ulong)aBuf[lVar2];
    }
    return uVar1;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils.hpp"
                ,0xa2,
                "T ot::commissioner::utils::Decode(const uint8_t *, size_t) [T = unsigned long]");
}

Assistant:

T Decode(const uint8_t *aBuf, size_t aLength)
{
    T ret = 0;

    ASSERT(aLength >= sizeof(T));

    for (size_t i = 0; i < sizeof(T); ++i)
    {
        ret = (ret << 8) | aBuf[i];
    }
    return ret;
}